

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* splitQuotedStr_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,char *str,char splitter)

{
  long local_58 [3];
  long local_40;
  byte local_31;
  char *pcStack_30;
  bool quoted;
  char *buf;
  char *prevPos;
  char *pcStack_18;
  char splitter_local;
  char *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rez;
  
  prevPos._6_1_ = 0;
  prevPos._7_1_ = splitter;
  pcStack_18 = str;
  str_local = (char *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  buf = pcStack_18;
  local_31 = 0;
  for (pcStack_30 = pcStack_18; *pcStack_30 != '\0'; pcStack_30 = pcStack_30 + 1) {
    if (*pcStack_30 == '\"') {
      local_31 = (local_31 ^ 0xff) & 1;
    }
    if ((*pcStack_30 == prevPos._7_1_) && ((local_31 & 1) == 0)) {
      local_40 = (long)pcStack_30 - (long)buf;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&buf,&local_40);
      buf = pcStack_30 + 1;
    }
  }
  if (buf < pcStack_30) {
    local_58[0] = (long)pcStack_30 - (long)buf;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,long>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&buf,local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> splitQuotedStr(const char* str, const char splitter)
{
    vector<string> rez;
    const char* prevPos = str;
    const char* buf = str;
    bool quoted = false;
    for (; *buf; buf++)
    {
        if (*buf == '"')
            quoted = !quoted;
        if (*buf == splitter && !quoted)
        {
            rez.emplace_back(prevPos, buf - prevPos);
            prevPos = buf + 1;
        }
    }
    if (buf > prevPos)
        rez.emplace_back(prevPos, buf - prevPos);
    return rez;
}